

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O1

void __thiscall
Diligent::VulkanDynamicHeap::ReleaseMasterBlocks
          (VulkanDynamicHeap *this,RenderDeviceVkImpl *DeviceVkImpl,Uint64 CmdQueueMask)

{
  pointer pAVar1;
  
  DynamicHeap::MasterBlockListBasedManager::ReleaseMasterBlocks<Diligent::RenderDeviceVkImpl>
            (&this->m_GlobalDynamicMemMgr->super_MasterBlockListBasedManager,&this->m_MasterBlocks,
             DeviceVkImpl,CmdQueueMask);
  pAVar1 = (this->m_MasterBlocks).
           super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_MasterBlocks).
      super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->m_MasterBlocks).
    super__Vector_base<Diligent::VariableSizeAllocationsManager::Allocation,_std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  this->m_CurrOffset = 0xffffffffffffffff;
  this->m_AvailableSize = 0;
  this->m_CurrAlignedSize = 0;
  this->m_CurrUsedSize = 0;
  this->m_CurrAllocatedSize = 0;
  return;
}

Assistant:

void VulkanDynamicHeap::ReleaseMasterBlocks(RenderDeviceVkImpl& DeviceVkImpl, Uint64 CmdQueueMask)
{
    m_GlobalDynamicMemMgr.ReleaseMasterBlocks(m_MasterBlocks, DeviceVkImpl, CmdQueueMask);
    m_MasterBlocks.clear();

    m_CurrOffset    = InvalidOffset;
    m_AvailableSize = 0;

    m_CurrUsedSize      = 0;
    m_CurrAlignedSize   = 0;
    m_CurrAllocatedSize = 0;
}